

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

Utest * __thiscall
TEST_DoublingFactorCounterTest_ThreeClosedTriplets_TestShell::createTest
          (TEST_DoublingFactorCounterTest_ThreeClosedTriplets_TestShell *this)

{
  TEST_DoublingFactorCounterTest_ThreeClosedTriplets_Test *this_00;
  char *in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  TEST_DoublingFactorCounterTest_ThreeClosedTriplets_TestShell *this_local;
  
  this_00 = (TEST_DoublingFactorCounterTest_ThreeClosedTriplets_Test *)
            operator_new(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0);
  TEST_DoublingFactorCounterTest_ThreeClosedTriplets_Test::
  TEST_DoublingFactorCounterTest_ThreeClosedTriplets_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(DoublingFactorCounterTest, ThreeClosedTriplets)
{
	addPair(Tile::WestWind);
	addTriplet(Tile::OneOfCharacters, false);
	addTriplet(Tile::TwoOfCircles, false);
	addQuad(Tile::ThreeOfBamboos, false);
	addSequence(Tile::SevenOfCharacters, false);

	s.winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::ThreeClosedTriplets));
	CHECK_EQUAL(2, r.doubling_factor);
}